

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O3

bool __thiscall chrono::ChSystem::DoStepKinematics(ChSystem *this,double step_size)

{
  if (this->is_initialized == false) {
    SetupInitial(this);
  }
  this->applied_forces_current = false;
  this->ch_time = step_size + this->ch_time;
  Update(this,true);
  DoAssembly(this,7);
  return (bool)(this->last_err ^ 1);
}

Assistant:

bool ChSystem::DoStepKinematics(double step_size) {
    if (!is_initialized)
        SetupInitial();

    applied_forces_current = false;

    ch_time += step_size;

    Update();

    // Newton Raphson kinematic equations solver
    DoAssembly(AssemblyLevel::POSITION | AssemblyLevel::VELOCITY | AssemblyLevel::ACCELERATION);

    if (last_err)
        return false;

    return true;
}